

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

int __thiscall
chaiscript::ChaiScript_Basic::eval<int>
          (ChaiScript_Basic *this,string *t_input,Exception_Handler *t_handler,string *t_filename)

{
  int iVar1;
  Type_Conversions *this_00;
  undefined1 local_30 [32];
  
  eval((ChaiScript_Basic *)local_30,(string *)this,(Exception_Handler *)t_input,(string *)t_handler)
  ;
  this_00 = &(this->m_engine).m_conversions;
  local_30._24_8_ = Type_Conversions::conversion_saves(this_00);
  local_30._16_8_ = this_00;
  iVar1 = boxed_cast<int>((Boxed_Value *)local_30,(Type_Conversions_State *)(local_30 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  return iVar1;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename = "__EVAL__") {
      return m_engine.boxed_cast<T>(eval(t_input, t_handler, t_filename));
    }